

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpathedit.cpp
# Opt level: O2

void QPathEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QIcon *icon;
  qsizetype qVar2;
  Data *pDVar3;
  QString *pQVar4;
  bool bVar5;
  Options OVar6;
  QArrayDataPointer<QString> *this;
  QArrayDataPointer<QString> *pQVar7;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<QString> local_a0;
  QArrayDataPointer<QString> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  this = &local_b8;
  pQVar7 = &local_b8;
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      plVar1 = (long *)_a[1];
      local_28.d = (Data *)*plVar1;
      local_28.ptr = (char16_t *)plVar1[1];
      local_28.size = plVar1[2];
      if (local_28.d != (Data *)0x0) {
        LOCK();
        ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pathChanged((QPathEdit *)_o,(QString *)&local_28);
      pQVar7 = (QArrayDataPointer<QString> *)&local_28;
      break;
    case 1:
      showDialog((QPathEdit *)_o);
      return;
    case 2:
      updateValidInfo((QPathEdit *)_o,(QString *)_a[1]);
      return;
    case 3:
      local_b8.d = (Data *)0x0;
      local_b8.ptr = (QString *)0x0;
      local_b8.size = 0;
      updateValidInfo((QPathEdit *)_o,(QString *)&local_b8);
      break;
    case 4:
      editTextUpdate((QPathEdit *)_o);
      return;
    case 5:
      dialogFileSelected((QPathEdit *)_o,(QString *)_a[1]);
      return;
    default:
      goto switchD_0011959e_caseD_4;
    }
    goto LAB_001199ba;
  case ReadProperty:
    if (0xb < (uint)_id) {
      return;
    }
    break;
  case WriteProperty:
    if (0xb < (uint)_id) {
      return;
    }
    icon = (QIcon *)*_a;
    switch(_id) {
    case 0:
      setStyle((QPathEdit *)_o,*(Style *)&icon->d,TrailingPosition);
      return;
    case 1:
      setDialogButtonIcon((QPathEdit *)_o,icon);
      return;
    case 2:
      setPathMode((QPathEdit *)_o,*(PathMode *)&icon->d);
      return;
    case 3:
      setDialogOptions((QPathEdit *)_o,(Options)*(Int *)&icon->d);
      return;
    case 4:
      setEditable((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 5:
      setAllowEmptyPath((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 6:
      setUseCompleter((QPathEdit *)_o,*(bool *)&icon->d);
      return;
    case 7:
      local_40.d = (Data *)icon->d;
      local_40.ptr = (char16_t *)icon[1].d;
      local_40.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_40.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_40.d = *(int *)local_40.d + 1;
        UNLOCK();
      }
      setDefaultDirectory((QPathEdit *)_o,(QString *)&local_40);
      pQVar7 = (QArrayDataPointer<QString> *)&local_40;
      break;
    case 8:
      local_58.d = (Data *)icon->d;
      local_58.ptr = (char16_t *)icon[1].d;
      local_58.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_58.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_58.d = *(int *)local_58.d + 1;
        UNLOCK();
      }
      setPath((QPathEdit *)_o,(QString *)&local_58,false);
      pQVar7 = (QArrayDataPointer<QString> *)&local_58;
      break;
    case 9:
      local_70.d = (Data *)icon->d;
      local_70.ptr = (char16_t *)icon[1].d;
      local_70.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_70.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_70.d = *(int *)local_70.d + 1;
        UNLOCK();
      }
      setPlaceholder((QPathEdit *)_o,(QString *)&local_70);
      pQVar7 = (QArrayDataPointer<QString> *)&local_70;
      break;
    case 10:
      local_88.d = (Data *)icon->d;
      local_88.ptr = (QString *)icon[1].d;
      local_88.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_88.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_88.d = *(int *)local_88.d + 1;
        UNLOCK();
      }
      setNameFilters((QPathEdit *)_o,(QStringList *)&local_88);
      this = &local_88;
      goto LAB_0011997d;
    case 0xb:
      local_a0.d = (Data *)icon->d;
      local_a0.ptr = (QString *)icon[1].d;
      local_a0.size = (qsizetype)icon[2].d;
      if ((QIconPrivate *)local_a0.d != (QIconPrivate *)0x0) {
        LOCK();
        *(int *)local_a0.d = *(int *)local_a0.d + 1;
        UNLOCK();
      }
      setMimeTypeFilters((QPathEdit *)_o,(QStringList *)&local_a0);
      this = &local_a0;
      goto LAB_0011997d;
    }
    goto LAB_001199ba;
  case ResetProperty:
    if (_id == 8) {
      clear((QPathEdit *)_o);
      return;
    }
    if (_id != 1) {
      return;
    }
    resetDialogButtonIcon((QPathEdit *)_o);
    return;
  default:
    goto switchD_0011959e_caseD_4;
  case IndexOfMethod:
    if ((*_a[1] == pathChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto switchD_0011959e_caseD_4;
  }
  pQVar7 = (QArrayDataPointer<QString> *)*_a;
  switch(_id) {
  case 0:
    OVar6.i = style((QPathEdit *)_o);
    break;
  case 1:
    dialogButtonIcon((QPathEdit *)&local_b8);
    QIcon::operator=((QIcon *)pQVar7,(QIcon *)&local_b8);
    QIcon::~QIcon((QIcon *)&local_b8);
    return;
  case 2:
    OVar6.i = pathMode((QPathEdit *)_o);
    break;
  case 3:
    OVar6 = dialogOptions((QPathEdit *)_o);
    break;
  case 4:
    bVar5 = isEditable((QPathEdit *)_o);
    goto LAB_0011995d;
  case 5:
    bVar5 = isEmptyPathAllowed((QPathEdit *)_o);
    goto LAB_0011995d;
  case 6:
    bVar5 = useCompleter((QPathEdit *)_o);
LAB_0011995d:
    *(bool *)&pQVar7->d = bVar5;
    return;
  case 7:
    defaultDirectory((QString *)&local_b8,(QPathEdit *)_o);
    goto LAB_00119992;
  case 8:
    path((QString *)&local_b8,(QPathEdit *)_o);
    goto LAB_00119992;
  case 9:
    placeholder((QString *)&local_b8,(QPathEdit *)_o);
LAB_00119992:
    pDVar3 = pQVar7->d;
    pQVar4 = pQVar7->ptr;
    pQVar7->d = local_b8.d;
    pQVar7->ptr = local_b8.ptr;
    qVar2 = pQVar7->size;
    pQVar7->size = local_b8.size;
    pQVar7 = &local_b8;
    local_b8.d = pDVar3;
    local_b8.ptr = pQVar4;
    local_b8.size = qVar2;
LAB_001199ba:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar7);
    return;
  case 10:
    nameFilters((QStringList *)&local_b8,(QPathEdit *)_o);
    goto LAB_0011996f;
  case 0xb:
    mimeTypeFilters((QStringList *)&local_b8,(QPathEdit *)_o);
LAB_0011996f:
    QArrayDataPointer<QString>::operator=(pQVar7,&local_b8);
LAB_0011997d:
    QArrayDataPointer<QString>::~QArrayDataPointer(this);
    return;
  }
  *(Int *)&pQVar7->d = OVar6.i;
switchD_0011959e_caseD_4:
  return;
}

Assistant:

void QPathEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->showDialog(); break;
        case 2: _t->updateValidInfo((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->updateValidInfo(); break;
        case 4: _t->editTextUpdate(); break;
        case 5: _t->dialogFileSelected((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QPathEdit::*)(QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QPathEdit::pathChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< Style*>(_v) = _t->style(); break;
        case 1: *reinterpret_cast< QIcon*>(_v) = _t->dialogButtonIcon(); break;
        case 2: *reinterpret_cast< PathMode*>(_v) = _t->pathMode(); break;
        case 3: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->dialogOptions(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->isEditable(); break;
        case 5: *reinterpret_cast< bool*>(_v) = _t->isEmptyPathAllowed(); break;
        case 6: *reinterpret_cast< bool*>(_v) = _t->useCompleter(); break;
        case 7: *reinterpret_cast< QString*>(_v) = _t->defaultDirectory(); break;
        case 8: *reinterpret_cast< QString*>(_v) = _t->path(); break;
        case 9: *reinterpret_cast< QString*>(_v) = _t->placeholder(); break;
        case 10: *reinterpret_cast< QStringList*>(_v) = _t->nameFilters(); break;
        case 11: *reinterpret_cast< QStringList*>(_v) = _t->mimeTypeFilters(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setStyle(*reinterpret_cast< Style*>(_v)); break;
        case 1: _t->setDialogButtonIcon(*reinterpret_cast< QIcon*>(_v)); break;
        case 2: _t->setPathMode(*reinterpret_cast< PathMode*>(_v)); break;
        case 3: _t->setDialogOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        case 4: _t->setEditable(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setAllowEmptyPath(*reinterpret_cast< bool*>(_v)); break;
        case 6: _t->setUseCompleter(*reinterpret_cast< bool*>(_v)); break;
        case 7: _t->setDefaultDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 8: _t->setPath(*reinterpret_cast< QString*>(_v)); break;
        case 9: _t->setPlaceholder(*reinterpret_cast< QString*>(_v)); break;
        case 10: _t->setNameFilters(*reinterpret_cast< QStringList*>(_v)); break;
        case 11: _t->setMimeTypeFilters(*reinterpret_cast< QStringList*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<QPathEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 1: _t->resetDialogButtonIcon(); break;
        case 8: _t->clear(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}